

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_yield(lua_State *L,int nresults)

{
  lua_State *L_00;
  ulong uVar1;
  ulong uVar2;
  int in_ESI;
  long in_RDI;
  TValue *top;
  TValue *t;
  cTValue *f;
  global_State *g;
  void *cf;
  ErrMsg in_stack_ffffffffffffffac;
  lua_State *in_stack_ffffffffffffffb0;
  undefined8 *local_48;
  undefined8 *local_40;
  int local_24;
  
  uVar1 = (ulong)*(uint *)(in_RDI + 8);
  if ((*(ulong *)(in_RDI + 0x30) & 1) == 0) {
    lj_err_msg(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  uVar2 = *(ulong *)(in_RDI + 0x30) & 0xfffffffffffffffc;
  if ((*(byte *)(uVar1 + 0x91) & 0x10) == 0) {
    local_40 = (undefined8 *)(*(long *)(in_RDI + 0x18) + (long)in_ESI * -8);
    if (*(undefined8 **)(in_RDI + 0x10) < local_40) {
      local_48 = *(undefined8 **)(in_RDI + 0x10);
      local_24 = in_ESI;
      while (local_24 = local_24 + -1, -1 < local_24) {
        *local_48 = *local_40;
        local_48 = local_48 + 1;
        local_40 = local_40 + 1;
      }
      *(undefined8 **)(in_RDI + 0x18) = local_48;
    }
    *(undefined8 *)(in_RDI + 0x30) = 0;
    *(undefined1 *)(in_RDI + 7) = 1;
    return -1;
  }
  L_00 = *(lua_State **)(in_RDI + 0x18);
  *(byte *)(uVar1 + 0x91) = *(byte *)(uVar1 + 0x91) & 0xef;
  uVar1 = (ulong)*(uint *)(uVar2 + 4);
  L_00->nextgc = (GCRef)(int)uVar1;
  L_00->marked = (char)(uVar1 >> 0x20);
  L_00->gct = (char)(uVar1 >> 0x28);
  L_00->dummy_ffid = (char)(uVar1 >> 0x30);
  L_00->status = (char)(uVar1 >> 0x38);
  L_00->glref = 0x321d;
  L_00->gclist = 0;
  (L_00->gclist).gcptr32 = *(int *)(uVar2 + 0x1c) - 4;
  *(int *)&L_00->base = (int)in_RDI;
  *(int *)((long)&L_00->base + 4) = ((int)L_00 - (int)*(undefined8 *)(in_RDI + 0x10)) + 0x1a;
  *(TValue ***)(in_RDI + 0x10) = &L_00->top;
  *(TValue ***)(in_RDI + 0x18) = &L_00->top;
  lj_err_throw(L_00,in_stack_ffffffffffffffac);
}

Assistant:

LUA_API int lua_yield(lua_State *L, int nresults)
{
  void *cf = L->cframe;
  global_State *g = G(L);
  if (cframe_canyield(cf)) {
    cf = cframe_raw(cf);
    if (!hook_active(g)) {  /* Regular yield: move results down if needed. */
      cTValue *f = L->top - nresults;
      if (f > L->base) {
	TValue *t = L->base;
	while (--nresults >= 0) copyTV(L, t++, f++);
	L->top = t;
      }
      L->cframe = NULL;
      L->status = LUA_YIELD;
      return -1;
    } else {  /* Yield from hook: add a pseudo-frame. */
      TValue *top = L->top;
      hook_leave(g);
      top->u64 = cframe_multres(cf);
      setcont(top+1, lj_cont_hook);
      setframe_pc(top+1, cframe_pc(cf)-1);
      setframe_gc(top+2, obj2gco(L));
      setframe_ftsz(top+2, (int)((char *)(top+3)-(char *)L->base)+FRAME_CONT);
      L->top = L->base = top+3;
#if LJ_TARGET_X64
      lj_err_throw(L, LUA_YIELD);
#else
      L->cframe = NULL;
      L->status = LUA_YIELD;
      lj_vm_unwind_c(cf, LUA_YIELD);
#endif
    }
  }
  lj_err_msg(L, LJ_ERR_CYIELD);
  return 0;  /* unreachable */
}